

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_settings::bulk_get
          (session_settings *this,
          function<void_(const_libtorrent::aux::session_settings_single_thread_&)> *f)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> l;
  function<void_(const_libtorrent::aux::session_settings_single_thread_&)> *f_local;
  session_settings *this_local;
  
  l._8_8_ = f;
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->m_mutex);
  ::std::function<void_(const_libtorrent::aux::session_settings_single_thread_&)>::operator()
            (f,&this->m_store);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void session_settings::bulk_get(std::function<void(session_settings_single_thread const&)> f) const
	{
		std::unique_lock<std::mutex> l(m_mutex);
		f(m_store);
	}